

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

void check_stable(char *name,_func_void_int_ptr_ptr_size_t *sort_fun,int size,int num_values)

{
  int iVar1;
  int **array_00;
  undefined4 in_ECX;
  int in_EDX;
  char *pcVar2;
  int **in_RSI;
  int **in_RDI;
  int **array;
  
  array_00 = (int **)malloc((long)in_EDX << 3);
  make_intp_array(in_RSI,CONCAT44(in_EDX,in_ECX),(int)((ulong)array_00 >> 0x20));
  (*(code *)in_RSI)(array_00,(long)in_EDX);
  iVar1 = verify_stable(in_RDI,(int64_t)in_RSI,in_EDX);
  pcVar2 = "UNSTABLE";
  if (iVar1 != 0) {
    pcVar2 = "stable";
  }
  printf("%21s -- %s\n",in_RDI,pcVar2);
  clean_intp_array(array_00,(int64_t)in_RDI);
  free(array_00);
  return;
}

Assistant:

void check_stable(char *name, void (*sort_fun)(int **arr, size_t size),
                  int size, int num_values) {
  int **array = malloc(sizeof(int *) * size);
  make_intp_array(array, size, num_values);
  sort_fun(array, size);
  printf("%21s -- %s\n", name,
         verify_stable(array, size, num_values) ? "stable" : "UNSTABLE");
  clean_intp_array(array, size);
  free(array);
}